

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

void __thiscall FileWriter::FileWriter(FileWriter *this,string *prefix)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  in_RDI[0x20] = (string)0x0;
  return;
}

Assistant:

FileWriter::FileWriter(const std::string& prefix) : prefix_(prefix) {
  force_ = false;
}